

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O0

int CTcSymPropBase::load_from_obj_file(CVmFile *fp,textchar_t *fname,tctarg_prop_id_t *prop_xlat)

{
  tctarg_prop_id_t tVar1;
  tc_symtype_t tVar2;
  char *__s;
  char *str;
  ulong uVar3;
  CTcPrsSymtab *pCVar4;
  textchar_t *in_RDX;
  CTcSymbolBase *in_RSI;
  CVmFile *in_RDI;
  CTcSymProp *sym;
  ulong id;
  size_t len;
  char *txt;
  textchar_t *in_stack_ffffffffffffff98;
  CTcPrsSymtab *in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  CTcSymPropBase *local_40;
  int local_4;
  
  __s = CTcSymbolBase::base_read_from_sym_file(in_RDI);
  if (__s == (char *)0x0) {
    local_4 = 1;
  }
  else {
    str = (char *)strlen(__s);
    uVar3 = CVmFile::read_uint4((CVmFile *)in_stack_ffffffffffffffa0);
    CTcParser::get_global_symtab(G_prs);
    local_40 = (CTcSymPropBase *)
               CTcPrsSymtab::find(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x211b94);
    if (local_40 == (CTcSymPropBase *)0x0) {
      local_40 = (CTcSymPropBase *)CTcSymbolBase::operator_new(0x211baf);
      tVar1 = CTcGenTarg::new_prop_id(G_cg);
      CTcSymProp::CTcSymProp
                ((CTcSymProp *)
                 CONCAT44(in_stack_ffffffffffffffb4,CONCAT22(tVar1,in_stack_ffffffffffffffb0)),str,
                 (size_t)__s,(int)((ulong)local_40 >> 0x20),
                 (tctarg_prop_id_t)((ulong)local_40 >> 0x10));
      pCVar4 = CTcParser::get_global_symtab(G_prs);
      (*pCVar4->_vptr_CTcPrsSymtab[3])(pCVar4,local_40);
    }
    else {
      tVar2 = CTcSymbolBase::get_type((CTcSymbolBase *)local_40);
      if (tVar2 != TC_SYM_PROP) {
        CTcSymbolBase::log_objfile_conflict(in_RSI,in_RDX,(tc_symtype_t)((ulong)__s >> 0x20));
        return 0;
      }
    }
    tVar1 = get_prop(local_40);
    *(tctarg_prop_id_t *)(in_RDX + uVar3 * 2) = tVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CTcSymPropBase::load_from_obj_file(class CVmFile *fp,
                                       const textchar_t *fname,
                                       tctarg_prop_id_t *prop_xlat)
{
    /* read the symbol name information */
    const char *txt;
    if ((txt = base_read_from_sym_file(fp)) == 0)
        return 1;
    size_t len = strlen(txt);

    /* read our property ID */
    ulong id = fp->read_uint4();

    /* 
     *   If this symbol is already defined, make sure the original
     *   definition is a property.  If it's not defined, define it anew.  
     */
    CTcSymProp *sym = (CTcSymProp *)G_prs->get_global_symtab()->find(txt, len);
    if (sym == 0)
    {
        /* 
         *   It's not defined yet - create the new definition and add it
         *   to the symbol table.  Allocate a new property ID for the
         *   symbol in the normal fashion.  
         */
        sym = new CTcSymProp(txt, len, FALSE, G_cg->new_prop_id());
        G_prs->get_global_symtab()->add_entry(sym);
    }
    else if (sym->get_type() != TC_SYM_PROP)
    {
        /* 
         *   It's not already defined as a property - log a symbol type
         *   conflict error 
         */
        sym->log_objfile_conflict(fname, TC_SYM_PROP);

        /* 
         *   proceed despite the error, since this is merely a symbol
         *   conflict and not a file corruption 
         */
        return 0;
    }

    /*
     *   Set the translation table entry for the symbol.  We know the
     *   original ID local to the object file, and we know the new global
     *   property ID.
     */
    prop_xlat[id] = sym->get_prop();

    /* success */
    return 0;
}